

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O2

void libdef_name(char *p,int kind)

{
  uint8_t *__dest;
  size_t sVar1;
  int iVar2;
  size_t __n;
  uint8_t *puVar3;
  
  __n = strlen(p);
  sVar1 = modnamelen;
  if (((kind != 0xc0) && (modnamelen < __n)) && (p[modnamelen] == '_')) {
    iVar2 = strncmp(p,modname,modnamelen);
    if (iVar2 == 0) {
      p = p + sVar1 + 1;
      __n = __n - (sVar1 + 1);
    }
  }
  if (__n < 0x3a) {
    if (optr + __n + 3 < (uint8_t *)((long)&optr + 1U)) {
      __dest = optr + 1;
      puVar3 = optr + __n + 1;
      *optr = (byte)kind | (byte)__n;
      memcpy(__dest,p,__n);
      optr = puVar3;
      return;
    }
    fwrite("Error: output buffer overflow\n",0x1e,1,_stderr);
  }
  else {
    fprintf(_stderr,"Error: string too long: \'%s\'\n",p);
  }
  exit(1);
}

Assistant:

static void libdef_name(const char *p, int kind)
{
  size_t n = strlen(p);
  if (kind != LIBINIT_STRING) {
    if (n > modnamelen && p[modnamelen] == '_' &&
	!strncmp(p, modname, modnamelen)) {
      p += modnamelen+1;
      n -= modnamelen+1;
    }
  }
  if (n > LIBINIT_MAXSTR) {
    fprintf(stderr, "Error: string too long: '%s'\n",  p);
    exit(1);
  }
  if (optr+1+n+2 > obuf+sizeof(obuf)) {  /* +2 for caller. */
    fprintf(stderr, "Error: output buffer overflow\n");
    exit(1);
  }
  *optr++ = (uint8_t)(n | kind);
  memcpy(optr, p, n);
  optr += n;
}